

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O0

void usage(void)

{
  printf("Usage: particles [-bfhs]\n");
  printf("Options:\n");
  printf(" -f   Run in full screen\n");
  printf(" -h   Display this help\n");
  printf(" -s   Run program as single thread (default is to use two threads)\n");
  printf("\n");
  printf("Program runtime controls:\n");
  printf(" W    Toggle wireframe mode\n");
  printf(" Esc  Exit program\n");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: particles [-bfhs]\n");
    printf("Options:\n");
    printf(" -f   Run in full screen\n");
    printf(" -h   Display this help\n");
    printf(" -s   Run program as single thread (default is to use two threads)\n");
    printf("\n");
    printf("Program runtime controls:\n");
    printf(" W    Toggle wireframe mode\n");
    printf(" Esc  Exit program\n");
}